

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yang_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  lys_node *__s;
  long lVar1;
  long lVar2;
  long lVar3;
  lyout *plVar4;
  ushort uVar5;
  LYS_NODE LVar6;
  int iVar7;
  int iVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  char *pcVar11;
  lys_node **pplVar12;
  lys_module *plVar13;
  lys_module *plVar14;
  long lVar15;
  lyout *plVar16;
  lys_ext_instance **pplVar17;
  lyout *plVar18;
  char *pcVar19;
  char *pcVar20;
  uint uVar21;
  ulong uVar22;
  lys_node **pplVar23;
  int iVar24;
  uint uVar25;
  LYS_NODE LVar26;
  ulong uVar27;
  int local_5c;
  ulong uStack_58;
  int flag_3;
  char *local_50;
  lyout *local_48;
  lys_node *local_40;
  lys_node_inout *inout;
  int flag;
  
  uVar22 = (ulong)(uint)level;
  LVar6 = node->nodetype;
  local_48 = out;
  local_40 = node;
  if ((LVar6 & mask) == LYS_UNKNOWN) goto LAB_0017d77b;
  if (((LVar6 & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) && ((node->flags & 0x40) != 0)) {
    return;
  }
  plVar9 = node->parent;
  if (plVar9 == (lys_node *)0x0) {
LAB_0017d761:
    ly_print(out,"\n");
    LVar6 = local_40->nodetype;
  }
  else if (plVar9->nodetype == LYS_AUGMENT) {
    if (plVar9->child != node) goto LAB_0017d761;
  }
  else if (node->prev->next != (lys_node *)0x0) goto LAB_0017d761;
LAB_0017d77b:
  plVar9 = local_40;
  plVar16 = local_48;
  LVar26 = mask & LVar6;
  uStack_58 = uVar22;
  switch(LVar26) {
  case LYS_CONTAINER:
    inout._4_4_ = 0;
    ly_print(local_48,"%*scontainer %s",(ulong)(uint)(level * 2),"",local_40->name);
    iVar7 = level + 1;
    yang_print_snode_common(plVar16,iVar7,plVar9,plVar9->module,(int *)((long)&inout + 4),1);
    if (plVar9[1].name != (char *)0x0) {
      yang_print_open(plVar16,(int *)((long)&inout + 4));
      yang_print_when(plVar16,iVar7,plVar9->module,(lys_when *)plVar9[1].name);
    }
    plVar16 = local_48;
    lVar15 = 0;
    for (uVar22 = 0; plVar18 = local_48, uVar22 < plVar9->iffeature_size; uVar22 = uVar22 + 1) {
      yang_print_open(plVar16,(int *)((long)&inout + 4));
      yang_print_iffeature
                (plVar16,iVar7,plVar9->module,
                 (lys_iffeature *)((long)&plVar9->iffeature->expr + lVar15));
      lVar15 = lVar15 + 0x20;
    }
    lVar15 = 0;
    for (uVar22 = 0; plVar16 = local_48, uVar22 < plVar9->padding[1]; uVar22 = uVar22 + 1) {
      yang_print_open(plVar18,(int *)((long)&inout + 4));
      yang_print_must(plVar18,iVar7,local_40->module,(lys_restr *)(local_40[1].dsc + lVar15));
      lVar15 = lVar15 + 0x38;
      plVar9 = local_40;
    }
    lVar1._0_2_ = plVar9[1].flags;
    lVar1._2_1_ = plVar9[1].ext_size;
    lVar1._3_1_ = plVar9[1].iffeature_size;
    lVar1._4_1_ = plVar9[1].padding[0];
    lVar1._5_1_ = plVar9[1].padding[1];
    lVar1._6_1_ = plVar9[1].padding[2];
    lVar1._7_1_ = plVar9[1].padding[3];
    if (lVar1 != 0) {
      yang_print_open(local_48,(int *)((long)&inout + 4));
      yang_print_substmt(plVar16,iVar7,LYEXT_SUBSTMT_PRESENCE,'\0',*(char **)&local_40[1].flags,
                         local_40->module,local_40->ext,(uint)local_40->ext_size);
      plVar9 = local_40;
    }
    yang_print_snode_common(plVar16,iVar7,plVar9,plVar9->module,(int *)((long)&inout + 4),0x74);
    plVar16 = local_48;
    lVar15 = 0;
    for (uVar22 = 0; plVar18 = local_48, uVar22 < *(ushort *)(plVar9->padding + 2);
        uVar22 = uVar22 + 1) {
      yang_print_open(plVar16,(int *)((long)&inout + 4));
      yang_print_typedef(plVar16,iVar7,plVar9->module,(lys_tpdf *)(plVar9[1].ref + lVar15));
      lVar15 = lVar15 + 0x80;
    }
    pplVar23 = &plVar9->child;
    pplVar12 = pplVar23;
    while (plVar16 = local_48, plVar10 = *pplVar12, plVar10 != (lys_node *)0x0) {
      if (plVar10->parent == plVar9) {
        yang_print_open(plVar18,(int *)((long)&inout + 4));
        yang_print_snode(plVar18,iVar7,plVar10,0x800);
        plVar9 = local_40;
      }
      pplVar12 = &plVar10->next;
    }
    pplVar12 = pplVar23;
    while (plVar18 = local_48, plVar10 = *pplVar12, plVar10 != (lys_node *)0x0) {
      if (plVar10->parent == plVar9) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_snode(plVar16,iVar7,plVar10,0x903f);
        plVar9 = local_40;
      }
      pplVar12 = &plVar10->next;
    }
    pplVar12 = pplVar23;
    while (plVar16 = local_48, plVar10 = *pplVar12, plVar10 != (lys_node *)0x0) {
      if (plVar10->parent == plVar9) {
        yang_print_open(plVar18,(int *)((long)&inout + 4));
        yang_print_snode(plVar18,iVar7,plVar10,0x4000);
        plVar9 = local_40;
      }
      pplVar12 = &plVar10->next;
    }
    while (plVar10 = *pplVar23, plVar18 = local_48, plVar10 != (lys_node *)0x0) {
      if (plVar10->parent == plVar9) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_snode(plVar16,iVar7,plVar10,0x80);
        plVar9 = local_40;
      }
      pplVar23 = &plVar10->next;
    }
    break;
  case LYS_CHOICE:
    inout._4_4_ = 0;
    ly_print(local_48,"%*schoice %s",(ulong)(uint)(level * 2),"",local_40->name);
    iVar7 = level + 1;
    yang_print_snode_common(plVar16,iVar7,plVar9,plVar9->module,(int *)((long)&inout + 4),1);
    lVar2._0_1_ = plVar9->hash[0];
    lVar2._1_1_ = plVar9->hash[1];
    lVar2._2_1_ = plVar9->hash[2];
    lVar2._3_1_ = plVar9->hash[3];
    lVar2._4_4_ = *(undefined4 *)&plVar9->field_0x6c;
    if (lVar2 != 0) {
      yang_print_open(plVar16,(int *)((long)&inout + 4));
      yang_print_when(plVar16,iVar7,plVar9->module,*(lys_when **)plVar9->hash);
    }
    plVar16 = local_48;
    lVar15 = 0;
    for (uVar22 = 0; plVar18 = local_48, uVar22 < plVar9->iffeature_size; uVar22 = uVar22 + 1) {
      yang_print_open(plVar16,(int *)((long)&inout + 4));
      yang_print_iffeature
                (plVar16,iVar7,plVar9->module,
                 (lys_iffeature *)((long)&plVar9->iffeature->expr + lVar15));
      lVar15 = lVar15 + 0x20;
    }
    if (plVar9[1].name != (char *)0x0) {
      yang_print_open(local_48,(int *)((long)&inout + 4));
      yang_print_substmt(plVar18,iVar7,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)local_40[1].name,
                         local_40->module,local_40->ext,(uint)local_40->ext_size);
      plVar9 = local_40;
    }
    yang_print_snode_common(plVar18,iVar7,plVar9,plVar9->module,(int *)((long)&inout + 4),0x7c);
    plVar16 = local_48;
    pplVar23 = &local_40->child;
    plVar9 = local_40;
    while (plVar10 = *pplVar23, plVar18 = local_48, plVar10 != (lys_node *)0x0) {
      if (plVar10->parent == plVar9) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_snode(plVar16,iVar7,plVar10,0x807f);
        plVar9 = local_40;
      }
      pplVar23 = &plVar10->next;
    }
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    goto switchD_0017d935_caseD_3;
  case LYS_LEAF:
    uVar25 = level * 2;
    ly_print(local_48,"%*sleaf %s {\n",(ulong)uVar25,"");
    uVar21 = level + 1;
    yang_print_snode_common(plVar16,uVar21,local_40,local_40->module,(int *)0x0,1);
    if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
      yang_print_when(plVar16,uVar21,local_40->module,(lys_when *)local_40[1].name);
    }
    lVar15 = 0;
    for (uVar22 = 0; plVar9 = local_40, plVar16 = local_48, uVar22 < local_40->iffeature_size;
        uVar22 = uVar22 + 1) {
      yang_print_iffeature
                (local_48,uVar21,local_40->module,
                 (lys_iffeature *)((long)&local_40->iffeature->expr + lVar15));
      lVar15 = lVar15 + 0x20;
    }
    yang_print_type(local_48,uVar21,local_40->module,(lys_type *)&local_40[1].ref);
    lVar15 = 0;
    yang_print_substmt(plVar16,uVar21,LYEXT_SUBSTMT_UNITS,'\0',(char *)plVar9[1].next,plVar9->module
                       ,plVar9->ext,(uint)plVar9->ext_size);
    for (uVar22 = 0; uVar22 < plVar9->padding[3]; uVar22 = uVar22 + 1) {
      yang_print_must(local_48,uVar21,plVar9->module,(lys_restr *)(plVar9[1].dsc + lVar15));
      lVar15 = lVar15 + 0x38;
    }
    plVar10 = plVar9[1].prev;
    plVar16 = local_48;
    if (plVar10 != (lys_node *)0x0) {
      if ((plVar9->flags & 0x1000) != 0) {
        local_50 = (char *)CONCAT44(local_50._4_4_,uVar25);
        uStack_58 = (ulong)uVar21;
        pcVar20 = strchr((char *)plVar10,0x3a);
        plVar9 = local_40;
        if (pcVar20 == (char *)0x0) {
          __assert_fail("strchr(leaf->dflt, \':\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yang.c"
                        ,0x470,"void yang_print_leaf(struct lyout *, int, const struct lys_node *)")
          ;
        }
        plVar13 = lys_node_module(local_40);
        pcVar20 = plVar13->name;
        __s = plVar9[1].prev;
        pcVar19 = strchr((char *)__s,0x3a);
        iVar7 = strncmp((char *)plVar10,pcVar20,(long)pcVar19 - (long)__s);
        plVar13 = plVar9->module;
        if (iVar7 == 0) {
          plVar10 = (lys_node *)lydict_insert(plVar13->ctx,pcVar19 + 1,0);
        }
        else {
          plVar10 = (lys_node *)transform_json2schema(plVar13,(char *)__s);
        }
        uVar21 = (uint)uStack_58;
        plVar9 = local_40;
        uVar25 = (uint)local_50;
      }
      plVar16 = local_48;
      yang_print_substmt(local_48,uVar21,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)plVar10,plVar9->module,
                         plVar9->ext,(uint)plVar9->ext_size);
      plVar9 = local_40;
      if ((local_40->flags & 0x1000) != 0) {
        lydict_remove(local_40->module->ctx,(char *)plVar10);
        plVar9 = local_40;
      }
    }
    yang_print_snode_common(plVar16,uVar21,plVar9,plVar9->module,(int *)0x0,0x7c);
    uVar22 = (ulong)uVar25;
    goto LAB_0017f322;
  case LYS_LEAFLIST:
    ly_print(local_48,"%*sleaf-list %s {\n",(ulong)(uint)(level * 2),"");
    uVar21 = level + 1;
    uVar22 = (ulong)uVar21;
    yang_print_snode_common(plVar16,uVar21,local_40,local_40->module,(int *)0x0,1);
    if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
      yang_print_when(plVar16,uVar21,local_40->module,(lys_when *)local_40[1].name);
    }
    lVar15 = 0;
    for (uVar27 = 0; plVar9 = local_40, plVar16 = local_48, uVar27 < local_40->iffeature_size;
        uVar27 = uVar27 + 1) {
      yang_print_iffeature
                (local_48,uVar21,local_40->module,
                 (lys_iffeature *)((long)&local_40->iffeature->expr + lVar15));
      lVar15 = lVar15 + 0x20;
    }
    yang_print_type(local_48,uVar21,local_40->module,(lys_type *)&local_40[1].ref);
    lVar15 = 0;
    yang_print_substmt(plVar16,uVar21,LYEXT_SUBSTMT_UNITS,'\0',(char *)plVar9[1].next,plVar9->module
                       ,plVar9->ext,(uint)plVar9->ext_size);
    for (uVar27 = 0; uVar27 < plVar9->padding[3]; uVar27 = uVar27 + 1) {
      yang_print_must(local_48,uVar21,plVar9->module,(lys_restr *)(plVar9[1].dsc + lVar15));
      lVar15 = lVar15 + 0x38;
    }
    plVar16 = local_48;
    uStack_58 = uVar22;
    for (uVar27 = 0; uVar27 < plVar9->padding[2]; uVar27 = uVar27 + 1) {
      pcVar20 = *(char **)((plVar9[1].prev)->padding + uVar27 * 8 + -0x1c);
      if ((plVar9->flags & 0x1000) != 0) {
        pcVar19 = strchr(pcVar20,0x3a);
        plVar9 = local_40;
        if (pcVar19 == (char *)0x0) {
          __assert_fail("strchr(llist->dflt[i], \':\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yang.c"
                        ,0x4bf,
                        "void yang_print_leaflist(struct lyout *, int, const struct lys_node *)");
        }
        plVar13 = lys_node_module(local_40);
        local_50 = plVar13->name;
        pcVar19 = *(char **)((plVar9[1].prev)->padding + uVar27 * 8 + -0x1c);
        pcVar11 = strchr(pcVar19,0x3a);
        iVar7 = strncmp(pcVar20,local_50,(long)pcVar11 - (long)pcVar19);
        plVar13 = plVar9->module;
        if (iVar7 == 0) {
          pcVar20 = lydict_insert(plVar13->ctx,pcVar11 + 1,0);
          plVar9 = local_40;
          uVar22 = uStack_58;
          plVar16 = local_48;
        }
        else {
          pcVar20 = transform_json2schema(plVar13,pcVar19);
          plVar9 = local_40;
          uVar22 = uStack_58;
          plVar16 = local_48;
        }
      }
      yang_print_substmt(plVar16,(int)uVar22,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar27,pcVar20,
                         plVar9->module,plVar9->ext,(uint)plVar9->ext_size);
      if ((local_40->flags & 0x1000) != 0) {
        lydict_remove(local_40->module->ctx,pcVar20);
      }
      plVar9 = local_40;
    }
    iVar7 = (int)uVar22;
    yang_print_snode_common(plVar16,iVar7,plVar9,plVar9->module,(int *)0x0,4);
    if (*(uint *)&local_40[1].priv != 0) {
      yang_print_unsigned(plVar16,iVar7,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                          (uint)local_40->ext_size,*(uint *)&local_40[1].priv);
    }
    uVar21 = *(uint *)((long)&local_40[1].priv + 4);
    if (uVar21 != 0) {
      yang_print_unsigned(plVar16,iVar7,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                          (uint)local_40->ext_size,uVar21);
    }
    plVar9 = local_40;
    if ((local_40->flags & 0x100) == 0) {
      iVar8 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
      if (iVar8 != -1) {
        pcVar20 = "system";
        goto LAB_0017f01a;
      }
    }
    else {
      pcVar20 = "user";
LAB_0017f01a:
      yang_print_substmt(plVar16,iVar7,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar20,plVar9->module,
                         plVar9->ext,(uint)plVar9->ext_size);
    }
    yang_print_snode_common(plVar16,iVar7,plVar9,plVar9->module,(int *)0x0,0x70);
    uVar22 = (ulong)(uint)(level * 2);
LAB_0017f322:
    ly_print(plVar16,"%*s}\n",uVar22,"");
    return;
  default:
    if (LVar26 == LYS_LIST) {
      inout._4_4_ = 0;
      ly_print(local_48,"%*slist %s",(ulong)(uint)(level * 2),"",local_40->name);
      uVar21 = level + 1;
      yang_print_snode_common(plVar16,uVar21,plVar9,plVar9->module,(int *)((long)&inout + 4),1);
      if (plVar9[1].name != (char *)0x0) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_when(plVar16,uVar21,plVar9->module,(lys_when *)plVar9[1].name);
      }
      plVar16 = local_48;
      lVar15 = 0;
      for (uVar22 = 0; plVar18 = local_48, uVar22 < plVar9->iffeature_size; uVar22 = uVar22 + 1) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_iffeature
                  (plVar16,uVar21,plVar9->module,
                   (lys_iffeature *)((long)&plVar9->iffeature->expr + lVar15));
        lVar15 = lVar15 + 0x20;
      }
      lVar15 = 0;
      for (uVar22 = 0; plVar16 = local_48, uVar22 < plVar9->padding[0]; uVar22 = uVar22 + 1) {
        yang_print_open(plVar18,(int *)((long)&inout + 4));
        yang_print_must(plVar18,uVar21,local_40->module,(lys_restr *)(local_40[1].dsc + lVar15));
        lVar15 = lVar15 + 0x38;
        plVar9 = local_40;
      }
      if (plVar9->padding[2] != '\0') {
        yang_print_open(local_48,(int *)((long)&inout + 4));
        yang_print_substmt(plVar16,uVar21,LYEXT_SUBSTMT_KEY,'\0',(char *)local_40[1].module,
                           local_40->module,local_40->ext,(uint)local_40->ext_size);
        plVar9 = local_40;
      }
      iVar7 = (int)uStack_58;
      local_50 = (char *)(ulong)uVar21;
      for (uVar22 = 0; iVar8 = (int)local_50, uVar22 < plVar9->padding[3]; uVar22 = uVar22 + 1) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_unique(plVar16,iVar8,local_40->module,
                          (lys_unique *)(local_40[1].ext + uVar22 * 2));
        plVar9 = local_40;
        pplVar17 = local_40->ext;
        iVar8 = -1;
        while (iVar8 = lys_ext_iter(pplVar17,plVar9->ext_size,(char)iVar8 + '\x01',
                                    LYEXT_SUBSTMT_UNIQUE), iVar8 != -1) {
          pplVar17 = plVar9->ext;
          if (uVar22 == pplVar17[iVar8]->insubstmt_index) {
            ly_print(plVar16," {\n");
            pplVar17 = local_40->ext;
            plVar9 = local_40;
            do {
              yang_print_extension_instances
                        (local_48,iVar7 + 2,plVar9->module,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar22,
                         pplVar17 + iVar8,1);
              plVar9 = local_40;
              pplVar17 = local_40->ext;
              do {
                iVar8 = lys_ext_iter(pplVar17,plVar9->ext_size,(char)iVar8 + '\x01',
                                     LYEXT_SUBSTMT_UNIQUE);
                plVar16 = local_48;
                if (iVar8 == -1) {
                  ly_print(local_48,"%*s}\n",uVar21 * 2,"");
                  goto LAB_0017e73b;
                }
                pplVar17 = plVar9->ext;
              } while (uVar22 != pplVar17[iVar8]->insubstmt_index);
            } while( true );
          }
        }
        ly_print(plVar16,";\n");
LAB_0017e73b:
        plVar9 = local_40;
      }
      yang_print_snode_common(plVar16,iVar8,plVar9,plVar9->module,(int *)((long)&inout + 4),4);
      if (*(int *)&local_40[1].iffeature != 0) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_unsigned(plVar16,iVar8,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)&local_40[1].iffeature);
      }
      if (*(int *)((long)&local_40[1].iffeature + 4) != 0) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_unsigned(plVar16,iVar8,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                            (uint)local_40->ext_size,*(uint *)((long)&local_40[1].iffeature + 4));
      }
      plVar9 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar7 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        plVar16 = local_48;
        if (iVar7 != -1) {
          pcVar20 = "system";
          goto LAB_0017f071;
        }
      }
      else {
        pcVar20 = "user";
LAB_0017f071:
        plVar16 = local_48;
        yang_print_open(local_48,(int *)((long)&inout + 4));
        plVar9 = local_40;
        yang_print_substmt(plVar16,iVar8,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar20,local_40->module,
                           local_40->ext,(uint)local_40->ext_size);
      }
      yang_print_snode_common(plVar16,iVar8,plVar9,plVar9->module,(int *)((long)&inout + 4),0x70);
      plVar16 = local_48;
      lVar15 = 0;
      for (uVar22 = 0; plVar18 = local_48, uVar22 < plVar9->padding[1]; uVar22 = uVar22 + 1) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_typedef(plVar16,iVar8,plVar9->module,(lys_tpdf *)(plVar9[1].ref + lVar15));
        lVar15 = lVar15 + 0x80;
      }
      pplVar23 = &plVar9->child;
      pplVar12 = pplVar23;
      while (plVar16 = local_48, plVar10 = *pplVar12, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == plVar9) {
          yang_print_open(plVar18,(int *)((long)&inout + 4));
          yang_print_snode(plVar18,iVar8,plVar10,0x800);
          plVar9 = local_40;
        }
        pplVar12 = &plVar10->next;
      }
      pplVar12 = pplVar23;
      while (plVar18 = local_48, plVar10 = *pplVar12, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == plVar9) {
          yang_print_open(plVar16,(int *)((long)&inout + 4));
          yang_print_snode(plVar16,iVar8,plVar10,0x903f);
          plVar9 = local_40;
        }
        pplVar12 = &plVar10->next;
      }
      pplVar12 = pplVar23;
      while (plVar16 = local_48, plVar10 = *pplVar12, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == plVar9) {
          yang_print_open(plVar18,(int *)((long)&inout + 4));
          yang_print_snode(plVar18,iVar8,plVar10,0x4000);
          plVar9 = local_40;
        }
        pplVar12 = &plVar10->next;
      }
      while (plVar10 = *pplVar23, plVar18 = local_48, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == plVar9) {
          yang_print_open(plVar16,(int *)((long)&inout + 4));
          yang_print_snode(plVar16,iVar8,plVar10,0x80);
          plVar9 = local_40;
        }
        pplVar23 = &plVar10->next;
      }
      break;
    }
    if (LVar26 == LYS_ANYXML) {
LAB_0017d811:
      inout._4_4_ = 0;
      plVar9 = lys_parent(local_40);
      pcVar20 = local_40->name;
      if (((plVar9 == (lys_node *)0x0) && (iVar7 = strcmp(pcVar20,"config"), iVar7 == 0)) &&
         (iVar7 = strcmp(local_40->module->name,"ietf-netconf"), iVar7 == 0)) {
        return;
      }
      plVar9 = local_40;
      plVar16 = local_48;
      pcVar19 = "anydata";
      if (local_40->nodetype == LYS_ANYXML) {
        pcVar19 = "anyxml";
      }
      ly_print(local_48,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar19,pcVar20);
      iVar7 = level + 1;
      yang_print_snode_common(plVar16,iVar7,plVar9,plVar9->module,(int *)((long)&inout + 4),1);
      if (plVar9[1].name != (char *)0x0) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_when(plVar16,iVar7,plVar9->module,(lys_when *)plVar9[1].name);
      }
      plVar16 = local_48;
      lVar15 = 0;
      for (uVar22 = 0; plVar4 = local_48, uVar22 < plVar9->iffeature_size; uVar22 = uVar22 + 1) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_iffeature
                  (plVar16,iVar7,plVar9->module,
                   (lys_iffeature *)((long)&plVar9->iffeature->expr + lVar15));
        lVar15 = lVar15 + 0x20;
      }
      lVar15 = 0;
      for (uVar22 = 0; plVar18 = local_48, uVar22 < plVar9->padding[3]; uVar22 = uVar22 + 1) {
        yang_print_open(plVar4,(int *)((long)&inout + 4));
        yang_print_must(plVar4,iVar7,local_40->module,(lys_restr *)(local_40[1].dsc + lVar15));
        lVar15 = lVar15 + 0x38;
        plVar9 = local_40;
      }
      yang_print_snode_common(local_48,iVar7,plVar9,plVar9->module,(int *)((long)&inout + 4),0x7c);
      break;
    }
    if (LVar26 == LYS_CASE) {
      inout._4_4_ = 0;
      if ((local_40->flags & 0x40) == 0) {
        ly_print(local_48,"%*scase %s",(ulong)(uint)(level * 2),"",local_40->name);
        level = level + 1;
        yang_print_snode_common(plVar16,level,local_40,local_40->module,(int *)((long)&inout + 4),1)
        ;
        lVar15._0_1_ = local_40->hash[0];
        lVar15._1_1_ = local_40->hash[1];
        lVar15._2_1_ = local_40->hash[2];
        lVar15._3_1_ = local_40->hash[3];
        lVar15._4_4_ = *(undefined4 *)&local_40->field_0x6c;
        if (lVar15 != 0) {
          yang_print_open(plVar16,(int *)((long)&inout + 4));
          yang_print_when(plVar16,level,local_40->module,*(lys_when **)local_40->hash);
        }
        yang_print_snode_common
                  (plVar16,level,local_40,local_40->module,(int *)((long)&inout + 4),0x72);
      }
      else {
        inout._4_4_ = 1;
      }
      plVar16 = local_48;
      pplVar23 = &local_40->child;
      plVar9 = local_40;
      while (plVar10 = *pplVar23, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == plVar9) {
          yang_print_open(plVar16,(int *)((long)&inout + 4));
          yang_print_snode(plVar16,level,plVar10,0x903f);
          plVar9 = local_40;
        }
        pplVar23 = &plVar10->next;
      }
      if ((plVar9->flags & 0x40) != 0) {
        return;
      }
      iVar7 = level + -1;
      plVar18 = local_48;
      iVar8 = inout._4_4_;
      goto LAB_0017f27b;
    }
    if (LVar26 == LYS_NOTIF) {
      inout._4_4_ = 0;
      lVar15 = 0;
      ly_print(local_48,"%*snotification %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar7 = level + 1;
      yang_print_snode_common(plVar16,iVar7,plVar9,plVar9->module,(int *)((long)&inout + 4),3);
      plVar16 = local_48;
      for (uVar22 = 0; uVar22 < plVar9->padding[1]; uVar22 = uVar22 + 1) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_must(plVar16,iVar7,plVar9->module,(lys_restr *)(plVar9[1].dsc + lVar15));
        lVar15 = lVar15 + 0x38;
      }
      yang_print_snode_common(local_48,iVar7,plVar9,plVar9->module,(int *)((long)&inout + 4),0x70);
      plVar16 = local_48;
      lVar15 = 0;
      for (uVar22 = 0; plVar18 = local_48, uVar22 < *(ushort *)(plVar9->padding + 2);
          uVar22 = uVar22 + 1) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_typedef(plVar16,iVar7,plVar9->module,(lys_tpdf *)(plVar9[1].name + lVar15));
        lVar15 = lVar15 + 0x80;
      }
      pplVar23 = &plVar9->child;
      pplVar12 = pplVar23;
      while (plVar16 = local_48, plVar10 = *pplVar12, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == plVar9) {
          yang_print_open(plVar18,(int *)((long)&inout + 4));
          yang_print_snode(plVar18,iVar7,plVar10,0x800);
          plVar9 = local_40;
        }
        pplVar12 = &plVar10->next;
      }
      while (plVar10 = *pplVar23, plVar18 = local_48, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == plVar9) {
          yang_print_open(plVar16,(int *)((long)&inout + 4));
          yang_print_snode(plVar16,iVar7,plVar10,0x903f);
          plVar9 = local_40;
        }
        pplVar23 = &plVar10->next;
      }
      break;
    }
    if (LVar26 == LYS_RPC) {
LAB_0017d9f2:
      inout._4_4_ = 0;
      pcVar20 = "action";
      if (LVar6 == LYS_RPC) {
        pcVar20 = "rpc";
      }
      lVar15 = 0;
      ly_print(local_48,"%*s%s %s",(ulong)(uint)(level * 2),"",pcVar20,local_40->name);
      iVar7 = level + 1;
      yang_print_snode_common(plVar16,iVar7,plVar9,plVar9->module,(int *)((long)&inout + 4),0x73);
      plVar16 = local_48;
      for (uVar22 = 0; plVar4 = local_48, uVar22 < *(ushort *)(plVar9->padding + 2);
          uVar22 = uVar22 + 1) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_typedef(plVar16,iVar7,plVar9->module,(lys_tpdf *)(plVar9[1].name + lVar15));
        lVar15 = lVar15 + 0x80;
      }
      pplVar23 = &plVar9->child;
      while (plVar10 = *pplVar23, plVar18 = local_48, plVar10 != (lys_node *)0x0) {
        if ((plVar10->parent == plVar9) &&
           (((plVar10->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN ||
            ((plVar10->flags & 0x40) == 0)))) {
          yang_print_open(plVar4,(int *)((long)&inout + 4));
          yang_print_snode(plVar4,iVar7,plVar10,0xe00);
          plVar9 = local_40;
        }
        pplVar23 = &plVar10->next;
      }
      break;
    }
    if ((LVar26 == LYS_INPUT) || (LVar26 == LYS_OUTPUT)) {
      ly_print(local_48,"%*s%s {\n",(ulong)(uint)(level * 2),"");
      iVar7 = level + 1;
      if (local_40->ext_size != 0) {
        yang_print_extension_instances
                  (plVar16,iVar7,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      lVar15 = 0;
      for (uVar22 = 0; uVar22 < local_40->padding[1]; uVar22 = uVar22 + 1) {
        yang_print_must(local_48,iVar7,local_40->module,(lys_restr *)(local_40[1].name + lVar15));
        lVar15 = lVar15 + 0x38;
      }
      lVar15 = 0;
      for (uVar22 = 0; uVar22 < *(ushort *)(local_40->padding + 2); uVar22 = uVar22 + 1) {
        yang_print_typedef(local_48,iVar7,local_40->module,
                           (lys_tpdf *)(*(long *)local_40->hash + lVar15));
        lVar15 = lVar15 + 0x80;
      }
      pplVar23 = &local_40->child;
      plVar9 = local_40;
      pplVar12 = pplVar23;
      while (plVar10 = *pplVar12, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == plVar9) {
          yang_print_snode(local_48,iVar7,plVar10,0x800);
          plVar9 = local_40;
        }
        pplVar12 = &plVar10->next;
      }
      while (plVar10 = *pplVar23, plVar10 != (lys_node *)0x0) {
        if (plVar10->parent == plVar9) {
          yang_print_snode(local_48,iVar7,plVar10,0x903f);
          plVar9 = local_40;
        }
        pplVar23 = &plVar10->next;
      }
      uVar22 = (ulong)(uint)(level * 2);
      plVar16 = local_48;
      goto LAB_0017f322;
    }
    if (LVar26 == LYS_GROUPING) {
      inout._4_4_ = 0;
      lVar15 = 0;
      ly_print(local_48,"%*sgrouping %s",(ulong)(uint)(level * 2),"",local_40->name);
      iVar24 = level + 1;
      yang_print_snode_common(plVar16,iVar24,plVar9,plVar9->module,(int *)((long)&inout + 4),0x71);
      plVar16 = local_48;
      for (uVar22 = 0; plVar18 = local_48, uVar22 < *(ushort *)(plVar9->padding + 2);
          uVar22 = uVar22 + 1) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_typedef(plVar16,iVar24,plVar9->module,
                           (lys_tpdf *)(*(long *)plVar9->hash + lVar15));
        lVar15 = lVar15 + 0x80;
      }
      pplVar12 = &plVar9->child;
      pplVar23 = pplVar12;
      while (plVar16 = local_48, plVar9 = *pplVar23, plVar9 != (lys_node *)0x0) {
        yang_print_open(plVar18,(int *)((long)&inout + 4));
        yang_print_snode(plVar18,iVar24,plVar9,0x800);
        pplVar23 = &plVar9->next;
      }
      pplVar23 = pplVar12;
      while (plVar18 = local_48, plVar9 = *pplVar23, plVar9 != (lys_node *)0x0) {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_snode(plVar16,iVar24,plVar9,0x903f);
        pplVar23 = &plVar9->next;
      }
      pplVar23 = pplVar12;
      while (plVar16 = local_48, plVar9 = *pplVar23, plVar9 != (lys_node *)0x0) {
        yang_print_open(plVar18,(int *)((long)&inout + 4));
        yang_print_snode(plVar18,iVar24,plVar9,0x4000);
        pplVar23 = &plVar9->next;
      }
      iVar7 = (int)uStack_58;
      while (plVar9 = *pplVar12, plVar18 = local_48, iVar8 = inout._4_4_, plVar9 != (lys_node *)0x0)
      {
        yang_print_open(plVar16,(int *)((long)&inout + 4));
        yang_print_snode(plVar16,iVar24,plVar9,0x80);
        pplVar12 = &plVar9->next;
      }
    }
    else {
      if (LVar26 != LYS_USES) {
        if (LVar26 != LYS_ACTION) {
          if (LVar26 != LYS_ANYDATA) {
            return;
          }
          goto LAB_0017d811;
        }
        goto LAB_0017d9f2;
      }
      local_5c = 0;
      ly_print(local_48,"%*suses ",(ulong)(uint)(level * 2),"");
      if (local_40->child != (lys_node *)0x0) {
        plVar13 = lys_node_module(local_40->child);
        plVar14 = lys_node_module(local_40);
        if (plVar14 != plVar13) {
          pcVar20 = transform_module_name2import_prefix(local_40->module,plVar13->name);
          ly_print(plVar16,"%s:",pcVar20);
        }
      }
      ly_print(plVar16,"%s",local_40->name);
      iVar24 = level + 1;
      yang_print_snode_common(plVar16,iVar24,local_40,local_40->module,&local_5c,1);
      lVar3._0_1_ = local_40->hash[0];
      lVar3._1_1_ = local_40->hash[1];
      lVar3._2_1_ = local_40->hash[2];
      lVar3._3_1_ = local_40->hash[3];
      lVar3._4_4_ = *(undefined4 *)&local_40->field_0x6c;
      if (lVar3 != 0) {
        yang_print_open(plVar16,&local_5c);
        yang_print_when(plVar16,iVar24,local_40->module,*(lys_when **)local_40->hash);
      }
      yang_print_snode_common(plVar16,iVar24,local_40,local_40->module,&local_5c,0x72);
      local_50 = (char *)CONCAT44(local_50._4_4_,level + 2);
      for (uVar27 = 0; plVar9 = local_40, uVar27 < local_40->padding[2]; uVar27 = uVar27 + 1) {
        yang_print_open(plVar16,&local_5c);
        plVar13 = plVar9->module;
        pcVar20 = plVar9[1].name;
        plVar9 = (lys_node *)(pcVar20 + uVar27 * 0x50);
        inout._4_4_ = 0;
        pcVar20 = transform_json2schema(plVar13,*(char **)(pcVar20 + uVar27 * 0x50));
        ly_print(plVar16,"%*srefine \"%s\"",(ulong)(uint)(iVar24 * 2),"",pcVar20);
        lydict_remove(plVar13->ctx,pcVar20);
        yang_print_snode_common(plVar16,(uint)local_50,plVar9,plVar13,(int *)((long)&inout + 4),3);
        lVar15 = 0;
        for (uVar22 = 0; plVar16 = local_48, uVar22 < plVar9->padding[2]; uVar22 = uVar22 + 1) {
          yang_print_open(local_48,(int *)((long)&inout + 4));
          yang_print_must(plVar16,(uint)local_50,plVar13,
                          (lys_restr *)(*(long *)&plVar9->nodetype + lVar15));
          lVar15 = lVar15 + 0x38;
        }
        if (*(short *)plVar9->padding == 1) {
          yang_print_open(local_48,(int *)((long)&inout + 4));
          yang_print_substmt(plVar16,(uint)local_50,LYEXT_SUBSTMT_PRESENCE,'\0',
                             (char *)plVar9->child,plVar13,plVar9->ext,(uint)plVar9->ext_size);
        }
        for (uVar22 = 0; uVar22 < plVar9->padding[3]; uVar22 = uVar22 + 1) {
          yang_print_open(plVar16,(int *)((long)&inout + 4));
          yang_print_substmt(plVar16,(uint)local_50,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar22,
                             *(char **)(plVar9->parent->padding + uVar22 * 8 + -0x1c),plVar13,
                             plVar9->ext,(uint)plVar9->ext_size);
        }
        pcVar20 = "true";
        if (((plVar9->flags & 1) != 0) || (pcVar20 = "false", (plVar9->flags & 2) != 0)) {
          yang_print_open(plVar16,(int *)((long)&inout + 4));
          yang_print_substmt(plVar16,(uint)local_50,LYEXT_SUBSTMT_CONFIG,'\0',pcVar20,plVar13,
                             plVar9->ext,(uint)plVar9->ext_size);
        }
        pcVar20 = "true";
        if (((plVar9->flags & 0x40) != 0) || (pcVar20 = "false", (char)plVar9->flags < '\0')) {
          yang_print_open(plVar16,(int *)((long)&inout + 4));
          yang_print_substmt(plVar16,(uint)local_50,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar20,plVar13,
                             plVar9->ext,(uint)plVar9->ext_size);
        }
        if ((plVar9->padding[0] & 0x18) != 0) {
          uVar5 = plVar9->flags;
          if ((uVar5 & 0x10) != 0) {
            yang_print_open(plVar16,(int *)((long)&inout + 4));
            yang_print_unsigned(plVar16,(uint)local_50,LYEXT_SUBSTMT_MIN,'\0',plVar13,plVar9->ext,
                                (uint)plVar9->ext_size,*(uint *)&plVar9->child);
            uVar5 = plVar9->flags;
          }
          if ((uVar5 & 8) != 0) {
            yang_print_open(plVar16,(int *)((long)&inout + 4));
            uVar21 = *(uint *)((long)&plVar9->child + 4);
            if (uVar21 == 0) {
              yang_print_substmt(plVar16,(uint)local_50,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plVar13,
                                 plVar9->ext,(uint)plVar9->ext_size);
            }
            else {
              yang_print_unsigned(plVar16,(uint)local_50,LYEXT_SUBSTMT_MAX,'\0',plVar13,plVar9->ext,
                                  (uint)plVar9->ext_size,uVar21);
            }
          }
        }
        yang_print_snode_common
                  (plVar16,(uint)local_50,plVar9,plVar13,(int *)((long)&inout + 4),0x60);
        yang_print_close(plVar16,iVar24,inout._4_4_);
        uVar22 = uStack_58;
      }
      lVar15 = 0;
      for (uVar27 = 0; plVar16 = local_48, iVar7 = (int)uVar22, plVar18 = local_48, iVar8 = local_5c
          , uVar27 < local_40->padding[3]; uVar27 = uVar27 + 1) {
        yang_print_open(local_48,&local_5c);
        uVar22 = uStack_58;
        yang_print_augment(plVar16,iVar24,(lys_node_augment *)(local_40[1].dsc + lVar15));
        lVar15 = lVar15 + 0x68;
      }
    }
    goto LAB_0017f27b;
  }
  iVar7 = (int)uStack_58;
  iVar8 = inout._4_4_;
LAB_0017f27b:
  yang_print_close(plVar18,iVar7,iVar8);
switchD_0017d935_caseD_3:
  return;
}

Assistant:

static void
yang_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    if (node->nodetype & mask) {
        if ((node->nodetype & (LYS_INPUT | LYS_OUTPUT)) && (node->flags & LYS_IMPLICIT)) {
            /* implicit input/output node is not supposed to be printed */
            return;
        } else if (!node->parent ||
                (node->parent->nodetype == LYS_AUGMENT && node != node->parent->child) ||
                (node->parent->nodetype != LYS_AUGMENT && node->prev->next)) {
            /* do not print the blank line before the first data-def node */
            ly_print(out, "\n");
        }
    }

    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yang_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yang_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yang_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yang_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yang_print_list(out, level, node);
        break;
    case LYS_USES:
        yang_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yang_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yang_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yang_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yang_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yang_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yang_print_notif(out, level, node);
        break;
    default:
        break;
    }
}